

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::CompressionParameters> *
kj::_::validateCompressionConfig
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,UnverifiedConfig *config,
          bool isAgreement)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  size_t size;
  byte bVar5;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *paVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  char *pcVar10;
  size_t unaff_R12;
  size_t sVar11;
  undefined1 uVar12;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *paVar13;
  String result;
  String local_78;
  uint local_5c;
  StringPtr local_58;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  uVar7 = CONCAT71(in_register_00000011,isAgreement);
  bVar1 = (config->serverMaxWindowBits).ptr.isSet;
  paVar13 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *)0x0;
  paVar6 = &(config->serverMaxWindowBits).ptr.field_1;
  if (bVar1 == false) {
    paVar6 = paVar13;
  }
  if (bVar1 == true) {
    sVar11 = (paVar6->value).size_;
    if (sVar11 == 0) goto LAB_003a03ea;
    uVar7 = uVar7 & 0xffffffff;
    pcVar4 = (paVar6->value).ptr;
    heapString(&local_78,sVar11);
    pcVar10 = (char *)local_78.content.size_;
    if ((char *)local_78.content.size_ != (char *)0x0) {
      pcVar10 = local_78.content.ptr;
    }
    memcpy(pcVar10,pcVar4,sVar11);
    local_40 = local_78.content.ptr;
    if ((char *)local_78.content.size_ == (char *)0x0) {
      local_40 = "";
    }
    local_38 = (char *)(local_78.content.size_ + ((char *)local_78.content.size_ == (char *)0x0));
    StringPtr::tryParseAs<unsigned_long>(&local_58);
    unaff_R12 = local_58.content.size_;
    bVar5 = (byte)local_58.content.ptr;
    sVar11 = local_78.content.size_;
    pcVar4 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar4,1,sVar11,sVar11,0);
    }
    if ((bVar5 & (unaff_R12 & 0xfffffffffffffff8) == 8) == 0) goto LAB_003a03ea;
    paVar13 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *)
              (ulong)(byte)((byte)uVar7 ^ 1);
    uVar9 = uVar7;
  }
  else {
    uVar9 = 0;
  }
  cVar8 = (char)uVar9;
  uVar12 = SUB81(paVar13,0);
  bVar1 = (config->clientMaxWindowBits).ptr.isSet;
  paVar6 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *)0x0;
  if (bVar1 != false) {
    paVar6 = &(config->clientMaxWindowBits).ptr.field_1;
  }
  sVar11 = unaff_R12;
  if (bVar1 == true) {
    size = (paVar6->value).size_;
    if (size == 0) {
      if ((char)uVar7 != '\0') goto LAB_003a03ea;
      cVar8 = true;
      unaff_R12 = 0xf;
    }
    else {
      local_5c = (uint)uVar7;
      pcVar4 = (paVar6->value).ptr;
      local_48 = unaff_R12;
      heapString(&local_78,size);
      pcVar10 = (char *)local_78.content.size_;
      if ((char *)local_78.content.size_ != (char *)0x0) {
        pcVar10 = local_78.content.ptr;
      }
      memcpy(pcVar10,pcVar4,size);
      local_40 = local_78.content.ptr;
      if ((char *)local_78.content.size_ == (char *)0x0) {
        local_40 = "";
      }
      local_38 = (char *)(local_78.content.size_ + ((char *)local_78.content.size_ == (char *)0x0));
      StringPtr::tryParseAs<unsigned_long>(&local_58);
      sVar11 = local_78.content.size_;
      pcVar4 = local_78.content.ptr;
      if (local_78.content.ptr != (char *)0x0) {
        local_78.content.ptr = (char *)0x0;
        local_78.content.size_ = 0;
        (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                  (local_78.content.disposer,pcVar4,1,sVar11,sVar11,0);
      }
      if (((byte)local_58.content.ptr & (local_58.content.size_ & 0xfffffffffffffff8) == 8) == 0) {
LAB_003a03ea:
        (__return_storage_ptr__->ptr).isSet = false;
        return __return_storage_ptr__;
      }
      uVar7 = (ulong)local_5c;
      if ((char)local_5c == '\0') {
        cVar8 = true;
        sVar11 = local_48;
        unaff_R12 = local_58.content.size_;
      }
      else {
        uVar12 = true;
        sVar11 = local_58.content.size_;
        unaff_R12 = local_48;
      }
    }
  }
  if ((char)uVar7 == '\0') {
    uVar2 = config->serverNoContextTakeover;
    uVar3 = config->clientNoContextTakeover;
  }
  else {
    uVar3 = config->serverNoContextTakeover;
    uVar2 = config->clientNoContextTakeover;
  }
  (__return_storage_ptr__->ptr).isSet = true;
  *(ushort *)&(__return_storage_ptr__->ptr).field_1 = CONCAT11(uVar3,uVar2);
  (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = (bool)uVar12;
  if ((bool)uVar12 != false) {
    *(size_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = sVar11;
  }
  (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = (bool)cVar8;
  if ((bool)cVar8 != false) {
    *(size_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = unaff_R12;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> validateCompressionConfig(UnverifiedConfig&& config,
    bool isAgreement) {
  // Verifies that the `config` is valid depending on whether we're validating a Request (offer) or
  // a Response (agreement). This essentially consumes the `UnverifiedConfig` and converts it into a
  // `CompressionParameters` struct.
  CompressionParameters result;

  KJ_IF_SOME(serverBits, config.serverMaxWindowBits) {
    if (serverBits.size() == 0) {
      // This means `server_max_window_bits` was passed without a value. Since a value is required,
      // this config is invalid.
      return kj::none;
    } else {
      KJ_IF_SOME(bits, kj::str(serverBits).tryParseAs<size_t>()) {
        if (bits < 8 || 15 < bits) {
          // Out of range -- invalid.
          return kj::none;
        }
        if (isAgreement) {
          result.inboundMaxWindowBits = bits;
        } else {
          result.outboundMaxWindowBits = bits;
        }
      } else {
        // Invalid ABNF, expected 1*DIGIT.
        return kj::none;
      }
    }
  }